

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::SweepPartialReusePages
          (SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,RecyclerSweep *recyclerSweep)

{
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> **ppSVar1;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  code *pcVar3;
  anon_class_48_6_f7e6f7a2_conflict2 fn;
  anon_class_56_6_5a5016e3 fn_00;
  bool bVar4;
  uint uVar5;
  Recycler *pRVar6;
  undefined4 *puVar7;
  BucketData<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_> *pBVar8;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar4 = RecyclerSweep::IsBackground(recyclerSweep);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ,bVar4);
  pRVar6 = HeapBucket::GetRecycler((HeapBucket *)this);
  if (pRVar6->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x1ae,"(this->GetRecycler()->inPartialCollectMode)",
                       "this->GetRecycler()->inPartialCollectMode");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  ppSVar1 = &(this->
             super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ).heapBlockList;
  pSVar2 = (this->
           super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           ).heapBlockList;
  (this->
  super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>).
  heapBlockList = (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  bVar4 = HeapBucket::AllocationsStartedDuringConcurrentSweep((HeapBucket *)this);
  local_48 = CONCAT71(local_48._1_7_,bVar4);
  fn.reuseBlocklist = ppSVar1;
  fn.recyclerSweep = recyclerSweep;
  fn.unusedBlockList = &this->partialHeapBlockList;
  fn.callback.this = this;
  fn._32_8_ = local_48;
  fn.this = this;
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::SweepPartialReusePages<Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::SweepPartialReusePages(Memory::RecyclerSweep&)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,bool)_1_>(Memory::RecyclerSweep&,Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*&,Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*&,bool,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::SweepPartialReusePages(Memory::RecyclerSweep&)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,bool)_1_)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (pSVar2,(SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,fn);
  uVar5 = HeapBucket::GetMediumBucketIndex((HeapBucket *)this);
  pBVar8 = (recyclerSweep->mediumWithBarrierData).bucketData + uVar5;
  pSVar2 = pBVar8->pendingSweepList;
  pBVar8->pendingSweepList =
       (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  pRVar6 = RecyclerSweep::GetRecycler(recyclerSweep);
  bVar4 = HeapBucket::AllocationsStartedDuringConcurrentSweep((HeapBucket *)this);
  uStack_40 = CONCAT71((int7)((ulong)this >> 8),bVar4);
  fn_00.reuseBlocklist = ppSVar1;
  fn_00.recyclerSweep = recyclerSweep;
  fn_00.unusedBlockList = &pBVar8->pendingSweepList;
  fn_00.callback.this = this;
  fn_00.callback.recycler = pRVar6;
  fn_00._40_8_ = uStack_40;
  fn_00.this = this;
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::SweepPartialReusePages<Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::SweepPartialReusePages(Memory::RecyclerSweep&)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,bool)_2_>(Memory::RecyclerSweep&,Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*&,Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*&,bool,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::SweepPartialReusePages(Memory::RecyclerSweep&)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,bool)_2_)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (pSVar2,fn_00);
  bVar4 = RecyclerSweep::IsBackground(recyclerSweep);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ,bVar4);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  StartAllocationAfterSweep
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
            );
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::SweepPartialReusePages(RecyclerSweep& recyclerSweep)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));
    Assert(this->GetRecycler()->inPartialCollectMode);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (this->AllowAllocationsDuringConcurrentSweep() && !this->AllocationsStartedDuringConcurrentSweep())
    {
        Assert(!this->IsAnyFinalizableBucket());
        this->StartAllocationDuringConcurrentSweep();
    }
#endif

    TBlockType * currentHeapBlockList = this->heapBlockList;
    this->heapBlockList = nullptr;
    SmallNormalHeapBucketBase<TBlockType>::SweepPartialReusePages(recyclerSweep, currentHeapBlockList, this->heapBlockList,
        this->partialHeapBlockList, this->AllocationsStartedDuringConcurrentSweep(),
        [this](TBlockType * heapBlock, bool isReused) 
    {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
        if (isReused)
        {
            DebugOnly(heapBlock->blockNotReusedInPartialHeapBlockList = false);

            DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
            if (heapBlock->HasFreeObject())
            {
                if (this->AllocationsStartedDuringConcurrentSweep())
                {
                    Assert(!this->IsAnyFinalizableBucket());
                    Assert(!heapBlock->isPendingConcurrentSweepPrep);
                    bool blockAddedToSList = HeapBucketT<TBlockType>::PushHeapBlockToSList(this->allocableHeapBlockListHead, heapBlock);

                    // If we encountered OOM while pushing the heapBlock to the SLIST we must add it to the heapBlockList so we don't lose track of it.
                    if (!blockAddedToSList)
                    {
                        //TODO: akatti: We should handle this gracefully and try to recover from this state.
                        AssertOrFailFastMsg(false, "OOM while adding a heap block to the SLIST during concurrent sweep.");
                    }
#ifdef RECYCLER_TRACE
                    else
                    {
                        this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**11**] finished SweepPartialReusePages, heapblock REUSED added to SLIST allocableHeapBlockListHead."));
                    }
#endif
                }
            }
            else
            {
                heapBlock->SetNextBlock(this->fullBlockList);
                this->fullBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**27**] finished SweepPartialReusePages, heapblock FULL added to fullBlockList."));
#endif
            }
        }
        else
        {
            DebugOnly(heapBlock->blockNotReusedInPartialHeapBlockList = true);
#ifdef RECYCLER_TRACE
            this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**12**] finished SweepPartialReusePages, heapblock NOT REUSED, added to partialHeapBlockList."));
#endif

#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
            if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
            {
                heapBlock->ResetConcurrentSweepAllocationCounts();
            }
#endif
        }
#endif
    });

#if ENABLE_CONCURRENT_GC
    // only collect data for pending sweep list but don't sweep yet
    // until we have adjusted the heuristics, and SweepPartialReusePages will
    // sweep the page that we are going to reuse in thread.
    TBlockType *& pendingSweepList = recyclerSweep.GetPendingSweepBlockList(this);
    currentHeapBlockList = pendingSweepList;
    pendingSweepList = nullptr;
    Recycler * recycler = recyclerSweep.GetRecycler();
    SmallNormalHeapBucketBase<TBlockType>::SweepPartialReusePages(recyclerSweep, currentHeapBlockList, this->heapBlockList,
        pendingSweepList, this->AllocationsStartedDuringConcurrentSweep(),
        [this, recycler](TBlockType * heapBlock, bool isReused)
        {
            if (isReused)
            {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
                DebugOnly(heapBlock->blockNotReusedInPendingList = false);
#endif
                // Finalizable blocks are always swept in thread, so shouldn't be here
                Assert(!heapBlock->IsAnyFinalizableBlock());

                // Page heap blocks are never swept concurrently
#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**20**] calling SweepObjects."));
#endif
                heapBlock->template SweepObjects<SweepMode_InThread>(recycler);
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
                DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
                if (heapBlock->HasFreeObject())
                {
                    if (this->AllocationsStartedDuringConcurrentSweep())
                    {
                        Assert(!this->IsAnyFinalizableBucket());
                        Assert(!heapBlock->isPendingConcurrentSweepPrep);
                        bool blockAddedToSList = HeapBucketT<TBlockType>::PushHeapBlockToSList(this->allocableHeapBlockListHead, heapBlock);

                        // If we encountered OOM while pushing the heapBlock to the SLIST we must add it to the heapBlockList so we don't lose track of it.
                        if (!blockAddedToSList)
                        {
                            //TODO: akatti: We should handle this gracefully and try to recover from this state.
                            AssertOrFailFastMsg(false, "OOM while adding a heap block to the SLIST during concurrent sweep.");
                        }
#ifdef RECYCLER_TRACE
                        else
                        {
                            this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**14**] finished SweepPartialReusePages, heapblock from PendingSweepList REUSED added to SLIST allocableHeapBlockListHead."));
                        }
#endif
                    }
                }
                else
                {
                    heapBlock->SetNextBlock(this->fullBlockList);
                    this->fullBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                    this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**28**] finished SweepPartialReusePages, heapblock FULL added to fullBlockList."));
#endif
                }
#endif

                // This block has been counted as concurrently swept, and now we changed our mind
                // and sweep it in thread. Remove the count
                RECYCLER_STATS_DEC(recycler, heapBlockConcurrentSweptCount[heapBlock->GetHeapBlockType()]);
            }
            else
            {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
                DebugOnly(heapBlock->blockNotReusedInPendingList = true);
#endif
#ifdef RECYCLER_TRACE
                this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**15**] finished SweepPartialReusePages, heapblock NOT REUSED added to pendingSweepList."));
#endif
            }
        }
    );
#endif

    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (!this->AllocationsStartedDuringConcurrentSweep())
#endif
    {
        this->StartAllocationAfterSweep();
    }

    // PARTIALGC-TODO: revisit partial heap blocks to see if they can be put back into use
    // since the heuristics limit may be been changed.
}